

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkLutminInt(Abc_Ntk_t *pNtk,int nLutSize,int fVerbose)

{
  DdManager *dd;
  int i;
  Abc_Ntk_t *pNtkDec;
  
  Abc_NtkBddReorder(pNtk,0);
  pNtkDec = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
  dd = (DdManager *)pNtkDec->pManFunc;
  i = Abc_NtkGetFaninMax(pNtk);
  Cudd_bddIthVar(dd,i);
  Abc_NtkLutminConstruct(pNtk,pNtkDec,nLutSize,fVerbose);
  Abc_NtkFinalize(pNtk,pNtkDec);
  Abc_NtkMinimumBase(pNtkDec);
  return pNtkDec;
}

Assistant:

Abc_Ntk_t * Abc_NtkLutminInt( Abc_Ntk_t * pNtk, int nLutSize, int fVerbose )
{
    extern void Abc_NtkBddReorder( Abc_Ntk_t * pNtk, int fVerbose );
    Abc_Ntk_t * pNtkDec;
    // minimize BDDs
//    Abc_NtkBddReorder( pNtk, fVerbose );
    Abc_NtkBddReorder( pNtk, 0 );
    // decompose one output at a time
    pNtkDec = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    // make sure the new manager has enough inputs
    Cudd_bddIthVar( (DdManager *)pNtkDec->pManFunc, Abc_NtkGetFaninMax(pNtk) );
    // put the results into the new network (save new CO drivers in old CO drivers)
    Abc_NtkLutminConstruct( pNtk, pNtkDec, nLutSize, fVerbose );
    // finalize the new network
    Abc_NtkFinalize( pNtk, pNtkDec );
    // make the network minimum base
    Abc_NtkMinimumBase( pNtkDec );
    return pNtkDec;
}